

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reverse.h
# Opt level: O0

void Eigen::internal::vectorwise_reverse_inplace_impl<1>::run<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *xpr)

{
  Index IVar1;
  ColsBlockXpr local_f8;
  RowwiseReturnType local_c0;
  ReverseReturnType local_88;
  ColsBlockXpr local_50;
  Index local_18;
  Index half;
  Matrix<double,__1,__1,_0,__1,__1> *xpr_local;
  
  half = (Index)xpr;
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  local_18 = IVar1 / 2;
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::leftCols
            (&local_50,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)half,local_18);
  DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rightCols
            (&local_f8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)half,local_18);
  DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>_>::rowwise
            (&local_c0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             &local_f8);
  VectorwiseOp<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_1>::reverse
            (&local_88,&local_c0);
  DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>>::
  swap<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>,1>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>> *)&local_50,
             (DenseBase<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>_>
              *)&local_88);
  return;
}

Assistant:

static void run(ExpressionType &xpr)
  {
    Index half = xpr.cols()/2;
    xpr.leftCols(half).swap(xpr.rightCols(half).rowwise().reverse());
  }